

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitBinary(PrintExpressionContents *this,Binary *curr)

{
  long lVar1;
  ostream **ppoVar2;
  char *pcVar3;
  ostream *poVar4;
  
  poVar4 = this->o;
  ppoVar2 = &this->o;
  Colors::outputColorCode(poVar4,"\x1b[35m");
  Colors::outputColorCode(poVar4,"\x1b[1m");
  switch(curr->op) {
  case AddInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.add";
    goto LAB_00a32046;
  case SubInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.sub";
    goto LAB_00a32046;
  case MulInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.mul";
    goto LAB_00a32046;
  case DivSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.div_s";
    goto LAB_00a32035;
  case DivUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.div_u";
    goto LAB_00a32035;
  case RemSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.rem_s";
    goto LAB_00a32035;
  case RemUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.rem_u";
    goto LAB_00a32035;
  case AndInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.and";
    goto LAB_00a32046;
  case OrInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.or";
    goto LAB_00a32018;
  case XorInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.xor";
    goto LAB_00a32046;
  case ShlInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.shl";
    goto LAB_00a32046;
  case ShrSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.shr_s";
    goto LAB_00a32035;
  case ShrUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.shr_u";
    goto LAB_00a32035;
  case RotLInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.rotl";
    break;
  case RotRInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.rotr";
    break;
  case EqInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.eq";
    goto LAB_00a32018;
  case NeInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.ne";
    goto LAB_00a32018;
  case LtSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.lt_s";
    break;
  case LtUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.lt_u";
    break;
  case LeSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.le_s";
    break;
  case LeUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.le_u";
    break;
  case GtSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.gt_s";
    break;
  case GtUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.gt_u";
    break;
  case GeSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.ge_s";
    break;
  case GeUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.ge_u";
    break;
  case AddInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.add";
    goto LAB_00a32046;
  case SubInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.sub";
    goto LAB_00a32046;
  case MulInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.mul";
    goto LAB_00a32046;
  case DivSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.div_s";
    goto LAB_00a32035;
  case DivUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.div_u";
    goto LAB_00a32035;
  case RemSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.rem_s";
    goto LAB_00a32035;
  case RemUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.rem_u";
    goto LAB_00a32035;
  case AndInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.and";
    goto LAB_00a32046;
  case OrInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.or";
    goto LAB_00a32018;
  case XorInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.xor";
    goto LAB_00a32046;
  case ShlInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.shl";
    goto LAB_00a32046;
  case ShrSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.shr_s";
    goto LAB_00a32035;
  case ShrUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.shr_u";
    goto LAB_00a32035;
  case RotLInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.rotl";
    break;
  case RotRInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.rotr";
    break;
  case EqInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.eq";
    goto LAB_00a32018;
  case NeInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.ne";
    goto LAB_00a32018;
  case LtSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.lt_s";
    break;
  case LtUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.lt_u";
    break;
  case LeSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.le_s";
    break;
  case LeUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.le_u";
    break;
  case GtSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.gt_s";
    break;
  case GtUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.gt_u";
    break;
  case GeSInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.ge_s";
    break;
  case GeUInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.ge_u";
    break;
  case AddFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.add";
    goto LAB_00a32046;
  case SubFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.sub";
    goto LAB_00a32046;
  case MulFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.mul";
    goto LAB_00a32046;
  case DivFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.div";
    goto LAB_00a32046;
  case CopySignFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.copysign";
    goto LAB_00a31ebd;
  case MinFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.min";
    goto LAB_00a32046;
  case MaxFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.max";
    goto LAB_00a32046;
  case EqFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.eq";
    goto LAB_00a32018;
  case NeFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.ne";
    goto LAB_00a32018;
  case LtFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.lt";
    goto LAB_00a32018;
  case LeFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.le";
    goto LAB_00a32018;
  case GtFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.gt";
    goto LAB_00a32018;
  case GeFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.ge";
    goto LAB_00a32018;
  case AddFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.add";
    goto LAB_00a32046;
  case SubFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.sub";
    goto LAB_00a32046;
  case MulFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.mul";
    goto LAB_00a32046;
  case DivFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.div";
    goto LAB_00a32046;
  case CopySignFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.copysign";
    goto LAB_00a31ebd;
  case MinFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.min";
    goto LAB_00a32046;
  case MaxFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.max";
    goto LAB_00a32046;
  case EqFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.eq";
    goto LAB_00a32018;
  case NeFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.ne";
    goto LAB_00a32018;
  case LtFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.lt";
    goto LAB_00a32018;
  case LeFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.le";
    goto LAB_00a32018;
  case GtFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.gt";
    goto LAB_00a32018;
  case GeFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.ge";
LAB_00a32018:
    lVar1 = 6;
    goto LAB_00a3204b;
  case EqVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.eq";
    break;
  case NeVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.ne";
    break;
  case LtSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.lt_s";
    goto LAB_00a31fef;
  case LtUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.lt_u";
    goto LAB_00a31fef;
  case GtSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.gt_s";
    goto LAB_00a31fef;
  case GtUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.gt_u";
    goto LAB_00a31fef;
  case LeSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.le_s";
    goto LAB_00a31fef;
  case LeUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.le_u";
    goto LAB_00a31fef;
  case GeSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.ge_s";
    goto LAB_00a31fef;
  case GeUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.ge_u";
    goto LAB_00a31fef;
  case EqVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.eq";
    break;
  case NeVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.ne";
    break;
  case LtSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.lt_s";
    goto LAB_00a31fef;
  case LtUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.lt_u";
    goto LAB_00a31fef;
  case GtSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.gt_s";
    goto LAB_00a31fef;
  case GtUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.gt_u";
    goto LAB_00a31fef;
  case LeSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.le_s";
    goto LAB_00a31fef;
  case LeUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.le_u";
    goto LAB_00a31fef;
  case GeSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.ge_s";
    goto LAB_00a31fef;
  case GeUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.ge_u";
    goto LAB_00a31fef;
  case EqVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.eq";
    break;
  case NeVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.ne";
    break;
  case LtSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.lt_s";
    goto LAB_00a31fef;
  case LtUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.lt_u";
    goto LAB_00a31fef;
  case GtSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.gt_s";
    goto LAB_00a31fef;
  case GtUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.gt_u";
    goto LAB_00a31fef;
  case LeSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.le_s";
    goto LAB_00a31fef;
  case LeUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.le_u";
    goto LAB_00a31fef;
  case GeSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.ge_s";
    goto LAB_00a31fef;
  case GeUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.ge_u";
    goto LAB_00a31fef;
  case EqVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.eq";
    break;
  case NeVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.ne";
    break;
  case LtSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.lt_s";
    goto LAB_00a31fef;
  case GtSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.gt_s";
    goto LAB_00a31fef;
  case LeSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.le_s";
    goto LAB_00a31fef;
  case GeSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.ge_s";
    goto LAB_00a31fef;
  case EqVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.eq";
    break;
  case NeVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.ne";
    break;
  case LtVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.lt";
    break;
  case GtVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.gt";
    break;
  case LeVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.le";
    break;
  case GeVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.ge";
    break;
  case EqVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.eq";
    break;
  case NeVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.ne";
    break;
  case LtVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.lt";
    break;
  case GtVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.gt";
    break;
  case LeVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.le";
    break;
  case GeVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.ge";
    break;
  case EqVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.eq";
    break;
  case NeVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.ne";
    break;
  case LtVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.lt";
    break;
  case GtVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.gt";
    break;
  case LeVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.le";
    break;
  case GeVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.ge";
    break;
  case AndVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.and";
    break;
  case OrVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.or";
LAB_00a32046:
    lVar1 = 7;
    goto LAB_00a3204b;
  case XorVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.xor";
    break;
  case AndNotVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.andnot";
    goto LAB_00a31ee0;
  case AddVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.add";
    goto LAB_00a32035;
  case AddSatSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.add_sat_s";
    goto LAB_00a31e7c;
  case AddSatUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.add_sat_u";
    goto LAB_00a31e7c;
  case SubVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.sub";
    goto LAB_00a32035;
  case SubSatSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.sub_sat_s";
    goto LAB_00a31e7c;
  case SubSatUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.sub_sat_u";
    goto LAB_00a31e7c;
  case MinSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.min_s";
    goto LAB_00a31ee0;
  case MinUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.min_u";
    goto LAB_00a31ee0;
  case MaxSVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.max_s";
    goto LAB_00a31ee0;
  case MaxUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.max_u";
    goto LAB_00a31ee0;
  case AvgrUVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.avgr_u";
    goto LAB_00a31ebd;
  case AddVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.add";
    goto LAB_00a32035;
  case AddSatSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.add_sat_s";
    goto LAB_00a31e7c;
  case AddSatUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.add_sat_u";
    goto LAB_00a31e7c;
  case SubVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.sub";
    goto LAB_00a32035;
  case SubSatSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.sub_sat_s";
    goto LAB_00a31e7c;
  case SubSatUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.sub_sat_u";
LAB_00a31e7c:
    lVar1 = 0xf;
    goto LAB_00a3204b;
  case MulVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.mul";
    goto LAB_00a32035;
  case MinSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.min_s";
    goto LAB_00a31ee0;
  case MinUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.min_u";
    goto LAB_00a31ee0;
  case MaxSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.max_s";
    goto LAB_00a31ee0;
  case MaxUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.max_u";
    goto LAB_00a31ee0;
  case AvgrUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.avgr_u";
LAB_00a31ebd:
    lVar1 = 0xc;
    goto LAB_00a3204b;
  case Q15MulrSatSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.q15mulr_sat_s";
    lVar1 = 0x13;
    goto LAB_00a3204b;
  case ExtMulLowSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extmul_low_i8x16_s";
    goto LAB_00a31dba;
  case ExtMulHighSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extmul_high_i8x16_s";
    goto LAB_00a31d10;
  case ExtMulLowUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extmul_low_i8x16_u";
    goto LAB_00a31dba;
  case ExtMulHighUVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extmul_high_i8x16_u";
    goto LAB_00a31d10;
  case AddVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.add";
    goto LAB_00a32035;
  case SubVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.sub";
    goto LAB_00a32035;
  case MulVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.mul";
    goto LAB_00a32035;
  case MinSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.min_s";
    goto LAB_00a31ee0;
  case MinUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.min_u";
    goto LAB_00a31ee0;
  case MaxSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.max_s";
    goto LAB_00a31ee0;
  case MaxUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.max_u";
LAB_00a31ee0:
    lVar1 = 0xb;
    goto LAB_00a3204b;
  case DotSVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.dot_i16x8_s";
    goto LAB_00a31b2e;
  case ExtMulLowSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extmul_low_i16x8_s";
    goto LAB_00a31dba;
  case ExtMulHighSVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extmul_high_i16x8_s";
    goto LAB_00a31d10;
  case ExtMulLowUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extmul_low_i16x8_u";
    goto LAB_00a31dba;
  case ExtMulHighUVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extmul_high_i16x8_u";
    goto LAB_00a31d10;
  case AddVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.add";
    goto LAB_00a32035;
  case SubVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.sub";
    goto LAB_00a32035;
  case MulVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.mul";
    goto LAB_00a32035;
  case ExtMulLowSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extmul_low_i32x4_s";
    goto LAB_00a31dba;
  case ExtMulHighSVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extmul_high_i32x4_s";
    goto LAB_00a31d10;
  case ExtMulLowUVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extmul_low_i32x4_u";
LAB_00a31dba:
    lVar1 = 0x18;
    goto LAB_00a3204b;
  case ExtMulHighUVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extmul_high_i32x4_u";
LAB_00a31d10:
    lVar1 = 0x19;
    goto LAB_00a3204b;
  case AddVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.add";
    goto LAB_00a32035;
  case SubVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.sub";
    goto LAB_00a32035;
  case MulVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.mul";
    goto LAB_00a32035;
  case DivVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.div";
    goto LAB_00a32035;
  case MinVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.min";
    goto LAB_00a32035;
  case MaxVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.max";
    goto LAB_00a32035;
  case PMinVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.pmin";
    goto LAB_00a31fef;
  case PMaxVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.pmax";
    goto LAB_00a31fef;
  case AddVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.add";
    goto LAB_00a32035;
  case SubVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.sub";
    goto LAB_00a32035;
  case MulVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.mul";
    goto LAB_00a32035;
  case DivVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.div";
    goto LAB_00a32035;
  case MinVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.min";
    goto LAB_00a32035;
  case MaxVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.max";
    goto LAB_00a32035;
  case PMinVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.pmin";
    goto LAB_00a31fef;
  case PMaxVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.pmax";
    goto LAB_00a31fef;
  case AddVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.add";
    goto LAB_00a32035;
  case SubVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.sub";
    goto LAB_00a32035;
  case MulVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.mul";
    goto LAB_00a32035;
  case DivVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.div";
    goto LAB_00a32035;
  case MinVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.min";
    goto LAB_00a32035;
  case MaxVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.max";
LAB_00a32035:
    lVar1 = 9;
    goto LAB_00a3204b;
  case PMinVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.pmin";
    goto LAB_00a31fef;
  case PMaxVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.pmax";
LAB_00a31fef:
    lVar1 = 10;
    goto LAB_00a3204b;
  case NarrowSVecI16x8ToVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.narrow_i16x8_s";
    goto LAB_00a31c0a;
  case NarrowUVecI16x8ToVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.narrow_i16x8_u";
    goto LAB_00a31c0a;
  case NarrowSVecI32x4ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.narrow_i32x4_s";
    goto LAB_00a31c0a;
  case NarrowUVecI32x4ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.narrow_i32x4_u";
LAB_00a31c0a:
    lVar1 = 0x14;
    goto LAB_00a3204b;
  case SwizzleVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.swizzle";
    lVar1 = 0xd;
    goto LAB_00a3204b;
  case RelaxedSwizzleVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.relaxed_swizzle";
    lVar1 = 0x15;
    goto LAB_00a3204b;
  case RelaxedMinVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.relaxed_min";
    goto LAB_00a31b2e;
  case RelaxedMaxVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.relaxed_max";
    goto LAB_00a31b2e;
  case RelaxedMinVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.relaxed_min";
    goto LAB_00a31b2e;
  case RelaxedMaxVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.relaxed_max";
LAB_00a31b2e:
    lVar1 = 0x11;
    goto LAB_00a3204b;
  case RelaxedQ15MulrSVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.relaxed_q15mulr_s";
    goto LAB_00a31aa5;
  case DotI8x16I7x16SToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.dot_i8x16_i7x16_s";
LAB_00a31aa5:
    lVar1 = 0x17;
    goto LAB_00a3204b;
  case InvalidBinary:
    handle_unreachable("unvalid binary operator",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x844);
  default:
    goto switchD_00a31380_default;
  }
  lVar1 = 8;
LAB_00a3204b:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar1);
switchD_00a31380_default:
  Colors::outputColorCode(*ppoVar2,"\x1b[0m");
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case AddInt32:
        o << "i32.add";
        break;
      case SubInt32:
        o << "i32.sub";
        break;
      case MulInt32:
        o << "i32.mul";
        break;
      case DivSInt32:
        o << "i32.div_s";
        break;
      case DivUInt32:
        o << "i32.div_u";
        break;
      case RemSInt32:
        o << "i32.rem_s";
        break;
      case RemUInt32:
        o << "i32.rem_u";
        break;
      case AndInt32:
        o << "i32.and";
        break;
      case OrInt32:
        o << "i32.or";
        break;
      case XorInt32:
        o << "i32.xor";
        break;
      case ShlInt32:
        o << "i32.shl";
        break;
      case ShrUInt32:
        o << "i32.shr_u";
        break;
      case ShrSInt32:
        o << "i32.shr_s";
        break;
      case RotLInt32:
        o << "i32.rotl";
        break;
      case RotRInt32:
        o << "i32.rotr";
        break;
      case EqInt32:
        o << "i32.eq";
        break;
      case NeInt32:
        o << "i32.ne";
        break;
      case LtSInt32:
        o << "i32.lt_s";
        break;
      case LtUInt32:
        o << "i32.lt_u";
        break;
      case LeSInt32:
        o << "i32.le_s";
        break;
      case LeUInt32:
        o << "i32.le_u";
        break;
      case GtSInt32:
        o << "i32.gt_s";
        break;
      case GtUInt32:
        o << "i32.gt_u";
        break;
      case GeSInt32:
        o << "i32.ge_s";
        break;
      case GeUInt32:
        o << "i32.ge_u";
        break;

      case AddInt64:
        o << "i64.add";
        break;
      case SubInt64:
        o << "i64.sub";
        break;
      case MulInt64:
        o << "i64.mul";
        break;
      case DivSInt64:
        o << "i64.div_s";
        break;
      case DivUInt64:
        o << "i64.div_u";
        break;
      case RemSInt64:
        o << "i64.rem_s";
        break;
      case RemUInt64:
        o << "i64.rem_u";
        break;
      case AndInt64:
        o << "i64.and";
        break;
      case OrInt64:
        o << "i64.or";
        break;
      case XorInt64:
        o << "i64.xor";
        break;
      case ShlInt64:
        o << "i64.shl";
        break;
      case ShrUInt64:
        o << "i64.shr_u";
        break;
      case ShrSInt64:
        o << "i64.shr_s";
        break;
      case RotLInt64:
        o << "i64.rotl";
        break;
      case RotRInt64:
        o << "i64.rotr";
        break;
      case EqInt64:
        o << "i64.eq";
        break;
      case NeInt64:
        o << "i64.ne";
        break;
      case LtSInt64:
        o << "i64.lt_s";
        break;
      case LtUInt64:
        o << "i64.lt_u";
        break;
      case LeSInt64:
        o << "i64.le_s";
        break;
      case LeUInt64:
        o << "i64.le_u";
        break;
      case GtSInt64:
        o << "i64.gt_s";
        break;
      case GtUInt64:
        o << "i64.gt_u";
        break;
      case GeSInt64:
        o << "i64.ge_s";
        break;
      case GeUInt64:
        o << "i64.ge_u";
        break;

      case AddFloat32:
        o << "f32.add";
        break;
      case SubFloat32:
        o << "f32.sub";
        break;
      case MulFloat32:
        o << "f32.mul";
        break;
      case DivFloat32:
        o << "f32.div";
        break;
      case CopySignFloat32:
        o << "f32.copysign";
        break;
      case MinFloat32:
        o << "f32.min";
        break;
      case MaxFloat32:
        o << "f32.max";
        break;
      case EqFloat32:
        o << "f32.eq";
        break;
      case NeFloat32:
        o << "f32.ne";
        break;
      case LtFloat32:
        o << "f32.lt";
        break;
      case LeFloat32:
        o << "f32.le";
        break;
      case GtFloat32:
        o << "f32.gt";
        break;
      case GeFloat32:
        o << "f32.ge";
        break;

      case AddFloat64:
        o << "f64.add";
        break;
      case SubFloat64:
        o << "f64.sub";
        break;
      case MulFloat64:
        o << "f64.mul";
        break;
      case DivFloat64:
        o << "f64.div";
        break;
      case CopySignFloat64:
        o << "f64.copysign";
        break;
      case MinFloat64:
        o << "f64.min";
        break;
      case MaxFloat64:
        o << "f64.max";
        break;
      case EqFloat64:
        o << "f64.eq";
        break;
      case NeFloat64:
        o << "f64.ne";
        break;
      case LtFloat64:
        o << "f64.lt";
        break;
      case LeFloat64:
        o << "f64.le";
        break;
      case GtFloat64:
        o << "f64.gt";
        break;
      case GeFloat64:
        o << "f64.ge";
        break;

      case EqVecI8x16:
        o << "i8x16.eq";
        break;
      case NeVecI8x16:
        o << "i8x16.ne";
        break;
      case LtSVecI8x16:
        o << "i8x16.lt_s";
        break;
      case LtUVecI8x16:
        o << "i8x16.lt_u";
        break;
      case GtSVecI8x16:
        o << "i8x16.gt_s";
        break;
      case GtUVecI8x16:
        o << "i8x16.gt_u";
        break;
      case LeSVecI8x16:
        o << "i8x16.le_s";
        break;
      case LeUVecI8x16:
        o << "i8x16.le_u";
        break;
      case GeSVecI8x16:
        o << "i8x16.ge_s";
        break;
      case GeUVecI8x16:
        o << "i8x16.ge_u";
        break;
      case EqVecI16x8:
        o << "i16x8.eq";
        break;
      case NeVecI16x8:
        o << "i16x8.ne";
        break;
      case LtSVecI16x8:
        o << "i16x8.lt_s";
        break;
      case LtUVecI16x8:
        o << "i16x8.lt_u";
        break;
      case GtSVecI16x8:
        o << "i16x8.gt_s";
        break;
      case GtUVecI16x8:
        o << "i16x8.gt_u";
        break;
      case LeSVecI16x8:
        o << "i16x8.le_s";
        break;
      case LeUVecI16x8:
        o << "i16x8.le_u";
        break;
      case GeSVecI16x8:
        o << "i16x8.ge_s";
        break;
      case GeUVecI16x8:
        o << "i16x8.ge_u";
        break;
      case EqVecI32x4:
        o << "i32x4.eq";
        break;
      case NeVecI32x4:
        o << "i32x4.ne";
        break;
      case LtSVecI32x4:
        o << "i32x4.lt_s";
        break;
      case LtUVecI32x4:
        o << "i32x4.lt_u";
        break;
      case GtSVecI32x4:
        o << "i32x4.gt_s";
        break;
      case GtUVecI32x4:
        o << "i32x4.gt_u";
        break;
      case LeSVecI32x4:
        o << "i32x4.le_s";
        break;
      case LeUVecI32x4:
        o << "i32x4.le_u";
        break;
      case GeSVecI32x4:
        o << "i32x4.ge_s";
        break;
      case GeUVecI32x4:
        o << "i32x4.ge_u";
        break;
      case EqVecI64x2:
        o << "i64x2.eq";
        break;
      case NeVecI64x2:
        o << "i64x2.ne";
        break;
      case LtSVecI64x2:
        o << "i64x2.lt_s";
        break;
      case GtSVecI64x2:
        o << "i64x2.gt_s";
        break;
      case LeSVecI64x2:
        o << "i64x2.le_s";
        break;
      case GeSVecI64x2:
        o << "i64x2.ge_s";
        break;
      case EqVecF16x8:
        o << "f16x8.eq";
        break;
      case NeVecF16x8:
        o << "f16x8.ne";
        break;
      case LtVecF16x8:
        o << "f16x8.lt";
        break;
      case GtVecF16x8:
        o << "f16x8.gt";
        break;
      case LeVecF16x8:
        o << "f16x8.le";
        break;
      case GeVecF16x8:
        o << "f16x8.ge";
        break;
      case EqVecF32x4:
        o << "f32x4.eq";
        break;
      case NeVecF32x4:
        o << "f32x4.ne";
        break;
      case LtVecF32x4:
        o << "f32x4.lt";
        break;
      case GtVecF32x4:
        o << "f32x4.gt";
        break;
      case LeVecF32x4:
        o << "f32x4.le";
        break;
      case GeVecF32x4:
        o << "f32x4.ge";
        break;
      case EqVecF64x2:
        o << "f64x2.eq";
        break;
      case NeVecF64x2:
        o << "f64x2.ne";
        break;
      case LtVecF64x2:
        o << "f64x2.lt";
        break;
      case GtVecF64x2:
        o << "f64x2.gt";
        break;
      case LeVecF64x2:
        o << "f64x2.le";
        break;
      case GeVecF64x2:
        o << "f64x2.ge";
        break;

      case AndVec128:
        o << "v128.and";
        break;
      case OrVec128:
        o << "v128.or";
        break;
      case XorVec128:
        o << "v128.xor";
        break;
      case AndNotVec128:
        o << "v128.andnot";
        break;

      case AddVecI8x16:
        o << "i8x16.add";
        break;
      case AddSatSVecI8x16:
        o << "i8x16.add_sat_s";
        break;
      case AddSatUVecI8x16:
        o << "i8x16.add_sat_u";
        break;
      case SubVecI8x16:
        o << "i8x16.sub";
        break;
      case SubSatSVecI8x16:
        o << "i8x16.sub_sat_s";
        break;
      case SubSatUVecI8x16:
        o << "i8x16.sub_sat_u";
        break;
      case MinSVecI8x16:
        o << "i8x16.min_s";
        break;
      case MinUVecI8x16:
        o << "i8x16.min_u";
        break;
      case MaxSVecI8x16:
        o << "i8x16.max_s";
        break;
      case MaxUVecI8x16:
        o << "i8x16.max_u";
        break;
      case AvgrUVecI8x16:
        o << "i8x16.avgr_u";
        break;
      case AddVecI16x8:
        o << "i16x8.add";
        break;
      case AddSatSVecI16x8:
        o << "i16x8.add_sat_s";
        break;
      case AddSatUVecI16x8:
        o << "i16x8.add_sat_u";
        break;
      case SubVecI16x8:
        o << "i16x8.sub";
        break;
      case SubSatSVecI16x8:
        o << "i16x8.sub_sat_s";
        break;
      case SubSatUVecI16x8:
        o << "i16x8.sub_sat_u";
        break;
      case MulVecI16x8:
        o << "i16x8.mul";
        break;
      case MinSVecI16x8:
        o << "i16x8.min_s";
        break;
      case MinUVecI16x8:
        o << "i16x8.min_u";
        break;
      case MaxSVecI16x8:
        o << "i16x8.max_s";
        break;
      case MaxUVecI16x8:
        o << "i16x8.max_u";
        break;
      case AvgrUVecI16x8:
        o << "i16x8.avgr_u";
        break;
      case Q15MulrSatSVecI16x8:
        o << "i16x8.q15mulr_sat_s";
        break;
      case ExtMulLowSVecI16x8:
        o << "i16x8.extmul_low_i8x16_s";
        break;
      case ExtMulHighSVecI16x8:
        o << "i16x8.extmul_high_i8x16_s";
        break;
      case ExtMulLowUVecI16x8:
        o << "i16x8.extmul_low_i8x16_u";
        break;
      case ExtMulHighUVecI16x8:
        o << "i16x8.extmul_high_i8x16_u";
        break;

      case AddVecI32x4:
        o << "i32x4.add";
        break;
      case SubVecI32x4:
        o << "i32x4.sub";
        break;
      case MulVecI32x4:
        o << "i32x4.mul";
        break;
      case MinSVecI32x4:
        o << "i32x4.min_s";
        break;
      case MinUVecI32x4:
        o << "i32x4.min_u";
        break;
      case MaxSVecI32x4:
        o << "i32x4.max_s";
        break;
      case MaxUVecI32x4:
        o << "i32x4.max_u";
        break;
      case DotSVecI16x8ToVecI32x4:
        o << "i32x4.dot_i16x8_s";
        break;
      case ExtMulLowSVecI32x4:
        o << "i32x4.extmul_low_i16x8_s";
        break;
      case ExtMulHighSVecI32x4:
        o << "i32x4.extmul_high_i16x8_s";
        break;
      case ExtMulLowUVecI32x4:
        o << "i32x4.extmul_low_i16x8_u";
        break;
      case ExtMulHighUVecI32x4:
        o << "i32x4.extmul_high_i16x8_u";
        break;

      case AddVecI64x2:
        o << "i64x2.add";
        break;
      case SubVecI64x2:
        o << "i64x2.sub";
        break;
      case MulVecI64x2:
        o << "i64x2.mul";
        break;
      case ExtMulLowSVecI64x2:
        o << "i64x2.extmul_low_i32x4_s";
        break;
      case ExtMulHighSVecI64x2:
        o << "i64x2.extmul_high_i32x4_s";
        break;
      case ExtMulLowUVecI64x2:
        o << "i64x2.extmul_low_i32x4_u";
        break;
      case ExtMulHighUVecI64x2:
        o << "i64x2.extmul_high_i32x4_u";
        break;

      case AddVecF16x8:
        o << "f16x8.add";
        break;
      case SubVecF16x8:
        o << "f16x8.sub";
        break;
      case MulVecF16x8:
        o << "f16x8.mul";
        break;
      case DivVecF16x8:
        o << "f16x8.div";
        break;
      case MinVecF16x8:
        o << "f16x8.min";
        break;
      case MaxVecF16x8:
        o << "f16x8.max";
        break;
      case PMinVecF16x8:
        o << "f16x8.pmin";
        break;
      case PMaxVecF16x8:
        o << "f16x8.pmax";
        break;

      case AddVecF32x4:
        o << "f32x4.add";
        break;
      case SubVecF32x4:
        o << "f32x4.sub";
        break;
      case MulVecF32x4:
        o << "f32x4.mul";
        break;
      case DivVecF32x4:
        o << "f32x4.div";
        break;
      case MinVecF32x4:
        o << "f32x4.min";
        break;
      case MaxVecF32x4:
        o << "f32x4.max";
        break;
      case PMinVecF32x4:
        o << "f32x4.pmin";
        break;
      case PMaxVecF32x4:
        o << "f32x4.pmax";
        break;
      case AddVecF64x2:
        o << "f64x2.add";
        break;
      case SubVecF64x2:
        o << "f64x2.sub";
        break;
      case MulVecF64x2:
        o << "f64x2.mul";
        break;
      case DivVecF64x2:
        o << "f64x2.div";
        break;
      case MinVecF64x2:
        o << "f64x2.min";
        break;
      case MaxVecF64x2:
        o << "f64x2.max";
        break;
      case PMinVecF64x2:
        o << "f64x2.pmin";
        break;
      case PMaxVecF64x2:
        o << "f64x2.pmax";
        break;

      case NarrowSVecI16x8ToVecI8x16:
        o << "i8x16.narrow_i16x8_s";
        break;
      case NarrowUVecI16x8ToVecI8x16:
        o << "i8x16.narrow_i16x8_u";
        break;
      case NarrowSVecI32x4ToVecI16x8:
        o << "i16x8.narrow_i32x4_s";
        break;
      case NarrowUVecI32x4ToVecI16x8:
        o << "i16x8.narrow_i32x4_u";
        break;

      case SwizzleVecI8x16:
        o << "i8x16.swizzle";
        break;

      case RelaxedMinVecF32x4:
        o << "f32x4.relaxed_min";
        break;
      case RelaxedMaxVecF32x4:
        o << "f32x4.relaxed_max";
        break;
      case RelaxedMinVecF64x2:
        o << "f64x2.relaxed_min";
        break;
      case RelaxedMaxVecF64x2:
        o << "f64x2.relaxed_max";
        break;
      case RelaxedSwizzleVecI8x16:
        o << "i8x16.relaxed_swizzle";
        break;
      case RelaxedQ15MulrSVecI16x8:
        o << "i16x8.relaxed_q15mulr_s";
        break;
      case DotI8x16I7x16SToVecI16x8:
        o << "i16x8.dot_i8x16_i7x16_s";
        break;

      case InvalidBinary:
        WASM_UNREACHABLE("unvalid binary operator");
    }
    restoreNormalColor(o);
  }